

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

void __thiscall
wabt::FileStream::FileStream(FileStream *this,string_view filename,Stream *log_stream)

{
  FILE *__stream;
  FILE *pFVar1;
  uint *puVar2;
  undefined1 local_48 [8];
  string_view filename_local;
  string filename_str;
  
  filename_local.data_ = (char *)filename.size_;
  local_48 = (undefined1  [8])filename.data_;
  (this->super_Stream).offset_ = 0;
  (this->super_Stream).result_.enum_ = Ok;
  (this->super_Stream).log_stream_ = log_stream;
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__FileStream_013e3628;
  this->file_ = (FILE *)0x0;
  this->offset_ = 0;
  this->should_close_ = false;
  string_view::to_string_abi_cxx11_((string *)&filename_local.size_,(string_view *)local_48);
  pFVar1 = fopen((char *)filename_local.size_,"wb");
  this->file_ = (FILE *)pFVar1;
  __stream = _stderr;
  if (pFVar1 == (FILE *)0x0) {
    puVar2 = (uint *)__errno_location();
    fprintf(__stream,"%s:%d: fopen name=\"%s\" failed, errno=%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/stream.cc"
            ,0xcf,filename_local.size_,(ulong)*puVar2);
  }
  else {
    this->should_close_ = true;
  }
  std::__cxx11::string::~string((string *)&filename_local.size_);
  return;
}

Assistant:

FileStream::FileStream(string_view filename, Stream* log_stream)
    : Stream(log_stream), file_(nullptr), offset_(0), should_close_(false) {
  std::string filename_str = filename.to_string();
  file_ = fopen(filename_str.c_str(), "wb");

  // TODO(binji): this is pretty cheesy, should come up with a better API.
  if (file_) {
    should_close_ = true;
  } else {
    ERROR("fopen name=\"%s\" failed, errno=%d\n", filename_str.c_str(), errno);
  }
}